

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::FeedRowAndObjNames<mp::StringFileWriter>
          (ExampleNLFeeder *this,StringFileWriter *wrt)

{
  bool bVar1;
  int i;
  long lVar2;
  
  bVar1 = mp::StringFileWriter::operator_cast_to_bool(wrt);
  if (bVar1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      mp::StringFileWriter::Write<char_const*>(wrt,this->mdl_->con_name[lVar2]);
    }
    mp::StringFileWriter::Write<char_const*>(wrt,this->mdl_->obj_name);
    return;
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (wrt) {     // && output_desired
      for (int i=0; i<Model().n_con; ++i)
        wrt << Model().con_name[i];
      wrt << Model().obj_name;
    }
  }